

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# customwidgetsinfo.cpp
# Opt level: O2

bool __thiscall
CustomWidgetsInfo::extends
          (CustomWidgetsInfo *this,QString *classNameIn,QAnyStringView baseClassName)

{
  bool bVar1;
  bool bVar2;
  DomCustomWidget *pDVar3;
  long in_FS_OFFSET;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_88;
  ulong local_80;
  QArrayDataPointer<char16_t> local_78;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_60;
  char16_t *local_58;
  qsizetype local_50;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_48;
  size_t local_40;
  long local_38;
  
  local_40 = baseClassName.m_size;
  local_48 = baseClassName.field_0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(classNameIn->d).ptr;
  local_58 = (char16_t *)((classNameIn->d).size | 0x8000000000000000);
  bVar1 = comparesEqual((QAnyStringView *)&local_60,(QAnyStringView *)&local_48);
  bVar2 = true;
  if (!bVar1) {
    local_60 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(classNameIn->d).d;
    local_58 = (classNameIn->d).ptr;
    local_50 = (classNameIn->d).size;
    if ((Data *)local_60.m_data != (Data *)0x0) {
      LOCK();
      *(int *)local_60.m_data = *local_60.m_data + 1;
      UNLOCK();
    }
    while( true ) {
      pDVar3 = customWidget(this,(QString *)&local_60);
      if (pDVar3 == (DomCustomWidget *)0x0) break;
      local_78.d = (pDVar3->m_extends).d.d;
      local_78.ptr = (pDVar3->m_extends).d.ptr;
      local_78.size = (pDVar3->m_extends).d.size;
      if (local_78.d != (Data *)0x0) {
        LOCK();
        ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      bVar2 = comparesEqual((QString *)&local_60,(QString *)&local_78);
      if (bVar2) {
LAB_001381be:
        bVar2 = !bVar2;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        goto LAB_001381d0;
      }
      local_88.m_data_utf16 = local_78.ptr;
      local_80 = local_78.size | 0x8000000000000000;
      bVar1 = comparesEqual((QAnyStringView *)&local_88,(QAnyStringView *)&local_48);
      if (bVar1) goto LAB_001381be;
      QString::operator=((QString *)&local_60,(QString *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    }
    bVar2 = false;
LAB_001381d0:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CustomWidgetsInfo::extends(const QString &classNameIn, QAnyStringView baseClassName) const
{
    if (classNameIn == baseClassName)
        return true;

    QString className = classNameIn;
    while (const DomCustomWidget *c = customWidget(className)) {
        const QString extends = c->elementExtends();
        if (className == extends) // Faulty legacy custom widget entries exist.
            return false;
        if (extends == baseClassName)
            return true;
        className = extends;
    }
    return false;
}